

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

void __thiscall mat<4UL,_3UL>::set_col(mat<4UL,_3UL> *this,size_t idx,vec<4UL,_double> *v)

{
  double *pdVar1;
  double dVar2;
  size_t local_28;
  size_t i;
  vec<4UL,_double> *v_local;
  size_t idx_local;
  mat<4UL,_3UL> *this_local;
  
  if (idx < 3) {
    local_28 = 4;
    while (local_28 != 0) {
      dVar2 = vec<4UL,_double>::operator[](v,local_28 - 1);
      pdVar1 = vec<3UL,_double>::operator[](this->rows + (local_28 - 1),idx);
      *pdVar1 = dVar2;
      local_28 = local_28 - 1;
    }
    return;
  }
  __assert_fail("idx >= 0 && idx < ncols",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                ,0xbe,
                "void mat<4, 3>::set_col(const size_t, const vec<nrows, double> &) [nrows = 4, ncols = 3]"
               );
}

Assistant:

void set_col(const size_t idx, const vec<nrows, double>& v)
    {
        assert(idx >= 0 && idx < ncols);
        for (size_t i = nrows; i--; rows[i][idx] = v[i])
            ;
    }